

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.h
# Opt level: O2

void __thiscall Texture::Texture(Texture *this,char *img)

{
  bool bVar1;
  float *pfVar2;
  ulong uVar3;
  stbi_uc *psVar4;
  ostream *poVar5;
  int iVar6;
  int iVar7;
  int j;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  int i;
  int iVar12;
  int iVar13;
  int k;
  int iVar14;
  int iVar15;
  float fVar16;
  HDRLoaderResult result;
  string img_;
  
  this->type = TEXTURE_RECT;
  Vector3f::Vector3f(&this->color,0.0);
  *(undefined8 *)&(this->scale).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->scale).super__Function_base._M_functor + 8) = 0;
  (this->scale).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->scale)._M_invoker = (_Invoker_type)0x0;
  this->empty = false;
  std::__cxx11::string::string((string *)&img_,img,(allocator *)&result);
  std::__cxx11::string::substr((ulong)&result,(ulong)&img_);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &result,".hdr");
  std::__cxx11::string::~string((string *)&result);
  if (bVar1) {
    this->image_buff_stbi = (uchar *)0x0;
    bVar1 = HDRLoader::load(img,&result);
    iVar12 = result.height;
    if (!bVar1) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/texture.h"
                    ,0x22,"Texture::Texture(const char *)");
    }
    iVar15 = (int)((long)result.width / 2);
    iVar6 = iVar15 * result.height;
    uVar8 = (long)result.width / 2 & 0xffffffff;
    uVar3 = (long)((iVar6 / 2) * 3) << 2;
    if (iVar6 < -1) {
      uVar3 = 0xffffffffffffffff;
    }
    pfVar2 = (float *)operator_new__(uVar3);
    this->hdr_buff = pfVar2;
    this->image_w = iVar15;
    iVar15 = 0;
    uVar3 = (long)iVar12 / 2 & 0xffffffff;
    this->image_h = (int)((long)iVar12 / 2);
    this->image_c = 3;
    for (iVar12 = 0; iVar12 < (int)uVar8; iVar12 = iVar12 + 1) {
      iVar6 = 0;
      for (lVar9 = 0; lVar9 < (int)uVar3; lVar9 = lVar9 + 1) {
        iVar13 = iVar6;
        for (iVar14 = 0; iVar14 != 3; iVar14 = iVar14 + 1) {
          fVar16 = 0.0;
          iVar7 = iVar15 * result.height + iVar13;
          for (iVar10 = 0; iVar10 != 2; iVar10 = iVar10 + 1) {
            for (lVar11 = 0; lVar11 != 6; lVar11 = lVar11 + 3) {
              fVar16 = fVar16 + result.cols[iVar7 + (int)lVar11];
            }
            iVar7 = iVar7 + result.height * 3;
          }
          fVar16 = powf(fVar16 * 0.25,0.1);
          uVar3 = (ulong)(uint)this->image_h;
          iVar13 = iVar13 + 1;
          this->hdr_buff[(this->image_h * iVar12 + (int)lVar9) * 3 + iVar14] = fVar16;
        }
        iVar6 = iVar6 + 6;
      }
      uVar8 = (ulong)(uint)this->image_w;
      iVar15 = iVar15 + 6;
    }
  }
  else {
    this->hdr_buff = (float *)0x0;
    psVar4 = stbi_load(img,&this->image_w,&this->image_h,&this->image_c,0);
    this->image_buff_stbi = psVar4;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"loaded image ");
  poVar5 = std::operator<<(poVar5,img);
  poVar5 = std::operator<<(poVar5,": ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->image_w);
  poVar5 = std::operator<<(poVar5,"x");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->image_h);
  poVar5 = std::operator<<(poVar5,"x");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->image_c);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&img_);
  return;
}

Assistant:

Texture(const char* img) :type(TEXTURE_RECT)
	{
		std::string img_ = img;
		if (img_.substr(img_.size() - 4) == ".hdr") {
			image_buff_stbi = nullptr;
			HDRLoaderResult result;
			bool ret = HDRLoader::load(img, result);
			assert(ret);
			hdr_buff = new float[result.width / 2 * result.height / 2 * 3];
			image_w = result.width/2;
			image_h = result.height/2;
			image_c = 3;
			for(int i=0;i<image_w;++i)
				for(int j=0;j<image_h;++j)
					for (int k = 0; k < 3; ++k)
					{
						float s = 0;
						for (int w = 0; w < 2; ++w)
							for (int g = 0; g < 2; ++g)
								s += result.cols[(i * 2 + w) * result.height * 3 + (j * 2 + g) * 3 + k];
						hdr_buff[i * image_h * 3 + j * 3 + k] = powf(s / 4, 0.1);
					}
		}
		else {
			hdr_buff = nullptr;
			image_buff_stbi = stbi_load(img, &image_w, &image_h, &image_c, 0);
		}
		std::cerr << "loaded image " << img << ": " << image_w << "x" << image_h << "x" << image_c << "\n";
	}